

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
google::protobuf::Arena::Create<std::__cxx11::string,std::__cxx11::string>
          (Arena *arena,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  pair<void_*,_google::protobuf::internal::SerialArena::CleanupNode_*> pVar1;
  
  if (arena == (Arena *)0x0) {
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  }
  else {
    pVar1 = AllocateAlignedWithCleanup(arena,0x20,(type_info *)&std::__cxx11::string::typeinfo);
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pVar1.first;
    (pVar1.second)->elem = this;
    (pVar1.second)->cleanup = internal::arena_destruct_object<std::__cxx11::string>;
  }
  std::__cxx11::string::string((string *)this,(string *)args);
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* Create(Arena* arena, Args&&... args) {
    return CreateInternal<T>(arena, std::is_convertible<T*, MessageLite*>(),
                             static_cast<Args&&>(args)...);
  }